

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int lua_getinfo(lua_State *L,char *what,lua_Debug *ar)

{
  int iVar1;
  char *pcVar2;
  lua_State *in_RDX;
  char *in_RSI;
  long in_RDI;
  TValue *i_o;
  StkId func;
  CallInfo *ci;
  Closure *f;
  int status;
  int in_stack_ffffffffffffffbc;
  lua_State *in_stack_ffffffffffffffc0;
  CallInfo *in_stack_ffffffffffffffc8;
  Closure *f_00;
  GCObject *f_01;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  char *local_10;
  
  f_01 = (GCObject *)0x0;
  f_00 = (Closure *)0x0;
  if (*in_RSI == '>') {
    in_stack_ffffffffffffffc8 = (CallInfo *)(*(long *)(in_RDI + 0x10) + -0x10);
    local_10 = in_RSI + 1;
    f_01 = (GCObject *)in_stack_ffffffffffffffc8->base;
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + -0x10;
  }
  else {
    local_10 = in_RSI;
    if (*(int *)((long)&in_RDX->hook + 4) != 0) {
      f_00 = (Closure *)(*(long *)(in_RDI + 0x50) + (long)*(int *)((long)&in_RDX->hook + 4) * 0x28);
      f_01 = (GCObject *)**(undefined8 **)&(f_00->c).tt;
    }
  }
  iVar1 = auxgetinfo(in_RDX,(char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (lua_Debug *)&f_01->gch,f_00,in_stack_ffffffffffffffc8);
  pcVar2 = strchr(local_10,0x66);
  if (pcVar2 != (char *)0x0) {
    if (f_01 == (GCObject *)0x0) {
      *(undefined4 *)(*(long *)(in_RDI + 0x10) + 8) = 0;
    }
    else {
      in_stack_ffffffffffffffc0 = *(lua_State **)(in_RDI + 0x10);
      in_stack_ffffffffffffffc0->next = f_01;
      in_stack_ffffffffffffffc0->tt = '\x06';
      in_stack_ffffffffffffffc0->marked = '\0';
      in_stack_ffffffffffffffc0->status = '\0';
      in_stack_ffffffffffffffc0->field_0xb = 0;
    }
    if (*(long *)(in_RDI + 0x38) - *(long *)(in_RDI + 0x10) < 0x11) {
      luaD_growstack(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
    }
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 0x10;
  }
  pcVar2 = strchr(local_10,0x4c);
  if (pcVar2 != (char *)0x0) {
    collectvalidlines((lua_State *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),&f_01->cl);
  }
  return iVar1;
}

Assistant:

static int lua_getinfo(lua_State*L,const char*what,lua_Debug*ar){
int status;
Closure*f=NULL;
CallInfo*ci=NULL;
if(*what=='>'){
StkId func=L->top-1;
luai_apicheck(L,ttisfunction(func));
what++;
f=clvalue(func);
L->top--;
}
else if(ar->i_ci!=0){
ci=L->base_ci+ar->i_ci;
f=clvalue(ci->func);
}
status=auxgetinfo(L,what,ar,f,ci);
if(strchr(what,'f')){
if(f==NULL)setnilvalue(L->top);
else setclvalue(L,L->top,f);
incr_top(L);
}
if(strchr(what,'L'))
collectvalidlines(L,f);
return status;
}